

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O2

int32_t pow5bits(int32_t e)

{
  if (e < 0) {
    __assert_fail("e >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/membuf.c"
                  ,0xdb,"int32_t pow5bits(const int32_t)");
  }
  if ((uint)e < 0xdc9) {
    return ((uint)(e * 0x12934f) >> 0x13) + 1;
  }
  __assert_fail("e <= 3528",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/membuf.c"
                ,0xdc,"int32_t pow5bits(const int32_t)");
}

Assistant:

static inline int32_t pow5bits(const int32_t e) {
	// This approximation works up to the point that the multiplication overflows at e = 3529.
	// If the multiplication were done in 64 bits, it would fail at 5^4004 which is just greater
	// than 2^9297.
	assert(e >= 0);
	assert(e <= 3528);
	return (int32_t) (((((uint32_t) e) * 1217359) >> 19) + 1);
}